

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

int xmlSchemaGetCanonValue(xmlSchemaValPtr val,xmlChar **retValue)

{
  xmlChar xVar1;
  xmlChar *__s;
  long lVar2;
  xmlChar *pxVar3;
  xmlSchemaValPtr value;
  uint uVar4;
  long lVar5;
  char *__format;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined8 uVar20;
  char buf [30];
  
  if (val == (xmlSchemaValPtr)0x0 || retValue == (xmlChar **)0x0) {
    return -1;
  }
  *retValue = (xmlChar *)0x0;
  switch(val->type) {
  case XML_SCHEMAS_STRING:
    pcVar7 = (char *)(val->value).decimal.str;
    if ((xmlChar *)pcVar7 == (xmlChar *)0x0) {
LAB_001ad7fa:
      pcVar7 = "";
    }
    break;
  case XML_SCHEMAS_NORMSTRING:
    pxVar3 = (val->value).decimal.str;
    if (pxVar3 == (xmlChar *)0x0) goto LAB_001ad7fa;
    pxVar3 = xmlSchemaWhiteSpaceReplace(pxVar3);
    goto LAB_001ad353;
  case XML_SCHEMAS_DECIMAL:
    pxVar3 = (val->value).decimal.str;
    pcVar7 = (char *)(pxVar3 + (*pxVar3 == '+'));
    break;
  case XML_SCHEMAS_TIME:
    if ((*(byte *)((long)&val->value + 0x18) & 1) == 0) {
      uVar4 = (val->value).decimal.integralPlaces;
      snprintf(buf,0x1e,"%02u:%02u:%02.14g",(val->value).date.sec,(ulong)(uVar4 >> 9 & 0x1f),
               (ulong)(uVar4 >> 0xe & 0x3f));
    }
    else {
      value = xmlSchemaDateNormalize(val,0.0);
      if (value == (xmlSchemaValPtr)0x0) {
        return -1;
      }
      uVar4 = (value->value).decimal.integralPlaces;
      snprintf(buf,0x1e,"%02u:%02u:%02.14gZ",(value->value).date.sec,(ulong)(uVar4 >> 9 & 0x1f),
               (ulong)(uVar4 >> 0xe & 0x3f));
LAB_001ad913:
      xmlSchemaFreeValue(value);
    }
    goto LAB_001ad953;
  case XML_SCHEMAS_GDAY:
    pxVar3 = (xmlChar *)(*xmlMalloc)(6);
    *retValue = pxVar3;
    if (pxVar3 == (xmlChar *)0x0) {
      return -1;
    }
    uVar4 = (val->value).decimal.integralPlaces >> 4 & 0x1f;
    pcVar7 = "---%02u";
    goto LAB_001ad698;
  case XML_SCHEMAS_GMONTH:
    pxVar3 = (xmlChar *)(*xmlMalloc)(6);
    *retValue = pxVar3;
    if (pxVar3 == (xmlChar *)0x0) {
      return -1;
    }
    uVar4 = (val->value).decimal.integralPlaces & 0xf;
    pcVar7 = "--%02u";
LAB_001ad698:
    snprintf((char *)pxVar3,6,pcVar7,(ulong)uVar4);
    goto LAB_001ad9bb;
  case XML_SCHEMAS_GMONTHDAY:
    pxVar3 = (xmlChar *)(*xmlMalloc)(8);
    *retValue = pxVar3;
    if (pxVar3 == (xmlChar *)0x0) {
      return -1;
    }
    uVar4 = (val->value).decimal.integralPlaces;
    snprintf((char *)pxVar3,8,"--%02u-%02u",(ulong)(uVar4 & 0xf),(ulong)(uVar4 >> 4 & 0x1f));
    goto LAB_001ad9bb;
  case XML_SCHEMAS_GYEAR:
    snprintf(buf,0x1e,"%04ld",(val->value).decimal.str);
    goto LAB_001ad7c2;
  case XML_SCHEMAS_GYEARMONTH:
    lVar5 = (val->value).date.year;
    if (lVar5 < 0) {
      lVar5 = -lVar5;
      uVar4 = (val->value).decimal.integralPlaces;
      pcVar7 = "-%04ld-%02u";
    }
    else {
      uVar4 = (val->value).decimal.integralPlaces;
      pcVar7 = "%04ld-%02u";
    }
    snprintf(buf,0x23,pcVar7,lVar5,(ulong)(uVar4 & 0xf));
    goto LAB_001ad953;
  case XML_SCHEMAS_DATE:
    if ((*(byte *)((long)&val->value + 0x18) & 1) != 0) {
      value = xmlSchemaDateNormalize(val,0.0);
      if (value == (xmlSchemaValPtr)0x0) {
        return -1;
      }
      uVar4 = (value->value).decimal.integralPlaces;
      snprintf(buf,0x1e,"%04ld-%02u-%02uZ",(value->value).decimal.str,(ulong)(uVar4 & 0xf),
               (ulong)(uVar4 >> 4 & 0x1f));
      goto LAB_001ad913;
    }
    uVar4 = (val->value).decimal.integralPlaces;
    snprintf(buf,0x1e,"%04ld-%02u-%02u",(val->value).decimal.str,(ulong)(uVar4 & 0xf),
             (ulong)(uVar4 >> 4 & 0x1f));
    goto LAB_001ad953;
  case XML_SCHEMAS_DATETIME:
    if ((*(byte *)((long)&val->value + 0x18) & 1) != 0) {
      value = xmlSchemaDateNormalize(val,0.0);
      if (value == (xmlSchemaValPtr)0x0) {
        return -1;
      }
      uVar4 = (value->value).decimal.integralPlaces;
      snprintf(buf,0x32,"%04ld-%02u-%02uT%02u:%02u:%02.14gZ",(value->value).date.sec,
               (value->value).decimal.str,(ulong)(uVar4 & 0xf),(ulong)(uVar4 >> 4 & 0x1f),
               (ulong)(uVar4 >> 9 & 0x1f),(ulong)(uVar4 >> 0xe & 0x3f));
      goto LAB_001ad913;
    }
    uVar4 = (val->value).decimal.integralPlaces;
    snprintf(buf,0x32,"%04ld-%02u-%02uT%02u:%02u:%02.14g",(val->value).date.sec,
             (val->value).decimal.str,(ulong)(uVar4 & 0xf),(ulong)(uVar4 >> 4 & 0x1f),
             (ulong)(uVar4 >> 9 & 0x1f),(ulong)(uVar4 >> 0xe & 0x3f));
LAB_001ad953:
    pcVar7 = buf;
    break;
  case XML_SCHEMAS_DURATION:
    lVar5 = (val->value).date.year;
    lVar12 = -lVar5;
    if (0 < lVar5) {
      lVar12 = lVar5;
    }
    dVar13 = floor((double)lVar12 / 12.0);
    uVar9 = (long)(dVar13 - 9.223372036854776e+18) & (long)dVar13 >> 0x3f | (long)dVar13;
    dVar13 = (val->value).date.sec;
    dVar19 = ABS(dVar13);
    uVar20 = 0;
    dVar14 = floor(dVar19 / 86400.0);
    uVar11 = (long)dVar14 >> 0x3f & (long)(dVar14 - 9.223372036854776e+18) | (long)dVar14;
    lVar2 = uVar11 * 0x15180;
    auVar16._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar16._0_8_ = lVar2;
    auVar16._12_4_ = 0x45300000;
    dVar14 = dVar19 - ((auVar16._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
    if (dVar14 <= 0.0) {
      uVar6 = 0;
      uVar8 = 0;
      dVar15 = 0.0;
      dVar14 = dVar19;
    }
    else {
      dVar19 = floor(dVar14 / 3600.0);
      uVar6 = (long)(dVar19 - 9.223372036854776e+18) & (long)dVar19 >> 0x3f | (long)dVar19;
      lVar2 = uVar6 * 0xe10;
      auVar17._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar17._0_8_ = lVar2;
      auVar17._12_4_ = 0x45300000;
      dVar19 = dVar14 - ((auVar17._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
      dVar15 = 0.0;
      if (dVar19 <= 0.0) {
        uVar8 = 0;
      }
      else {
        dVar14 = floor(dVar19 / 60.0);
        uVar8 = (long)(dVar14 - 9.223372036854776e+18) & (long)dVar14 >> 0x3f | (long)dVar14;
        lVar2 = uVar8 * 0x3c;
        auVar18._8_4_ = (int)((ulong)lVar2 >> 0x20);
        auVar18._0_8_ = lVar2;
        auVar18._12_4_ = 0x45300000;
        dVar15 = dVar19 - ((auVar18._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
        dVar14 = dVar19;
      }
    }
    __format = "-P%luY%luM%luDT%luH%luM%.14gS";
    if (dVar13 < 0.0) {
      __format = "P%luY%luM%luDT%luH%luM%.14gS";
    }
    if (lVar5 < 0) {
      __format = "P%luY%luM%luDT%luH%luM%.14gS";
    }
    pcVar7 = buf;
    snprintf(pcVar7,100,__format,dVar15,uVar9,lVar12 + uVar9 * -0xc,uVar11,uVar6,uVar8,dVar14,uVar20
            );
    break;
  case XML_SCHEMAS_FLOAT:
    pxVar3 = (xmlChar *)(double)(val->value).f;
    sVar10 = 0x1e;
    goto LAB_001ad7b8;
  case XML_SCHEMAS_DOUBLE:
    pxVar3 = (val->value).decimal.str;
    sVar10 = 0x28;
LAB_001ad7b8:
    snprintf(buf,sVar10,"%01.14e",pxVar3);
LAB_001ad7c2:
    pcVar7 = buf;
    break;
  case XML_SCHEMAS_BOOLEAN:
    if ((val->value).b == 0) {
      pcVar7 = "false";
    }
    else {
      pcVar7 = "true";
    }
    break;
  case XML_SCHEMAS_TOKEN:
  case XML_SCHEMAS_LANGUAGE:
  case XML_SCHEMAS_NMTOKEN:
  case XML_SCHEMAS_NAME:
  case XML_SCHEMAS_NCNAME:
  case XML_SCHEMAS_ID:
  case XML_SCHEMAS_IDREF:
  case XML_SCHEMAS_ENTITY:
  case XML_SCHEMAS_NOTATION:
  case XML_SCHEMAS_ANYURI:
    pxVar3 = (val->value).decimal.str;
    if (pxVar3 == (xmlChar *)0x0) {
      return -1;
    }
    pxVar3 = xmlSchemaCollapseString(pxVar3);
LAB_001ad353:
    *retValue = pxVar3;
    if (pxVar3 != (xmlChar *)0x0) goto LAB_001ad9bb;
switchD_001ad2e4_caseD_2b:
    pcVar7 = (char *)(val->value).decimal.str;
    break;
  default:
    pxVar3 = xmlStrdup((xmlChar *)"???");
    *retValue = pxVar3;
    return 1;
  case XML_SCHEMAS_QNAME:
    if ((val->value).dur.day == 0) {
      pxVar3 = xmlStrdup((val->value).decimal.str);
      *retValue = pxVar3;
      return 0;
    }
    pxVar3 = xmlStrdup((xmlChar *)"{");
    *retValue = pxVar3;
    pxVar3 = xmlStrcat(pxVar3,(val->value).qname.uri);
    *retValue = pxVar3;
    pxVar3 = xmlStrcat(pxVar3,"}");
    *retValue = pxVar3;
    pxVar3 = xmlStrcat(pxVar3,(val->value).qname.uri);
    goto LAB_001ad9b8;
  case XML_SCHEMAS_INTEGER:
  case XML_SCHEMAS_NPINTEGER:
  case XML_SCHEMAS_NINTEGER:
  case XML_SCHEMAS_NNINTEGER:
  case XML_SCHEMAS_PINTEGER:
  case XML_SCHEMAS_INT:
  case XML_SCHEMAS_UINT:
  case XML_SCHEMAS_LONG:
  case XML_SCHEMAS_ULONG:
  case XML_SCHEMAS_SHORT:
  case XML_SCHEMAS_USHORT:
  case XML_SCHEMAS_BYTE:
  case XML_SCHEMAS_UBYTE:
    pxVar3 = (val->value).decimal.str;
    xVar1 = *pxVar3;
    sVar10 = (ulong)((val->value).decimal.integralPlaces + 2) - (ulong)(xVar1 == '+');
    __s = (xmlChar *)(*xmlMalloc)(sVar10);
    *retValue = __s;
    if (__s != (xmlChar *)0x0) {
      snprintf((char *)__s,sVar10,"%s",pxVar3 + (xVar1 == '+'));
    }
    goto LAB_001ad9bb;
  case XML_SCHEMAS_HEXBINARY:
  case XML_SCHEMAS_BASE64BINARY:
    goto switchD_001ad2e4_caseD_2b;
  }
  pxVar3 = xmlStrdup((xmlChar *)pcVar7);
LAB_001ad9b8:
  *retValue = pxVar3;
LAB_001ad9bb:
  return -(uint)(*retValue == (xmlChar *)0x0);
}

Assistant:

int
xmlSchemaGetCanonValue(xmlSchemaValPtr val, const xmlChar **retValue)
{
    if ((retValue == NULL) || (val == NULL))
	return (-1);
    *retValue = NULL;
    switch (val->type) {
	case XML_SCHEMAS_STRING:
	    if (val->value.str == NULL)
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "");
	    else
		*retValue =
		    BAD_CAST xmlStrdup((const xmlChar *) val->value.str);
	    break;
	case XML_SCHEMAS_NORMSTRING:
	    if (val->value.str == NULL)
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "");
	    else {
		*retValue = xmlSchemaWhiteSpaceReplace(
		    (const xmlChar *) val->value.str);
		if ((*retValue) == NULL)
		    *retValue = BAD_CAST xmlStrdup(
			(const xmlChar *) val->value.str);
	    }
	    break;
	case XML_SCHEMAS_TOKEN:
	case XML_SCHEMAS_LANGUAGE:
	case XML_SCHEMAS_NMTOKEN:
	case XML_SCHEMAS_NAME:
	case XML_SCHEMAS_NCNAME:
	case XML_SCHEMAS_ID:
	case XML_SCHEMAS_IDREF:
	case XML_SCHEMAS_ENTITY:
	case XML_SCHEMAS_NOTATION: /* Unclear */
	case XML_SCHEMAS_ANYURI:   /* Unclear */
	    if (val->value.str == NULL)
		return (-1);
	    *retValue =
		BAD_CAST xmlSchemaCollapseString(BAD_CAST val->value.str);
	    if (*retValue == NULL)
		*retValue =
		    BAD_CAST xmlStrdup((const xmlChar *) val->value.str);
	    break;
	case XML_SCHEMAS_QNAME:
	    /* TODO: Unclear in XML Schema 1.0. */
	    if (val->value.qname.uri == NULL) {
		*retValue = BAD_CAST xmlStrdup(BAD_CAST val->value.qname.name);
		return (0);
	    } else {
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "{");
		*retValue = BAD_CAST xmlStrcat((xmlChar *) (*retValue),
		    BAD_CAST val->value.qname.uri);
		*retValue = BAD_CAST xmlStrcat((xmlChar *) (*retValue),
		    BAD_CAST "}");
		*retValue = BAD_CAST xmlStrcat((xmlChar *) (*retValue),
		    BAD_CAST val->value.qname.uri);
	    }
	    break;
	case XML_SCHEMAS_DECIMAL: {
                xmlChar *start = val->value.decimal.str;
                if(start[0] == '+')
                {
                    start += 1;
                }
                *retValue = xmlStrdup(start);
	    }
	    break;
	case XML_SCHEMAS_INTEGER:
        case XML_SCHEMAS_PINTEGER:
        case XML_SCHEMAS_NPINTEGER:
        case XML_SCHEMAS_NINTEGER:
        case XML_SCHEMAS_NNINTEGER:
	case XML_SCHEMAS_LONG:
        case XML_SCHEMAS_BYTE:
        case XML_SCHEMAS_SHORT:
        case XML_SCHEMAS_INT:
	case XML_SCHEMAS_UINT:
        case XML_SCHEMAS_ULONG:
        case XML_SCHEMAS_USHORT:
        case XML_SCHEMAS_UBYTE: {
            xmlChar *start = val->value.decimal.str;
            /* 2 = sign+NULL */
            size_t bufSize = val->value.decimal.integralPlaces+2;
            if(start[0] == '+')
            {
                start += 1;
                bufSize -= 1;
            }
            *retValue = xmlMalloc(bufSize);
            if(*retValue) {
                /* no need to limit string length in format, it will only print bufSize-1 chars anyways */
                snprintf((char*)*retValue, bufSize, "%s", start);
            }
	    }
	    break;
	case XML_SCHEMAS_BOOLEAN:
	    if (val->value.b)
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "true");
	    else
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "false");
	    break;
	case XML_SCHEMAS_DURATION: {
		char buf[100];
		unsigned long year;
		unsigned long mon, day, hour = 0, min = 0;
		double sec = 0, left;

		/* TODO: Unclear in XML Schema 1.0 */
		/*
		* TODO: This results in a normalized output of the value
		* - which is NOT conformant to the spec -
		* since the exact values of each property are not
		* recoverable. Think about extending the structure to
		* provide a field for every property.
		*/
		year = (unsigned long) FQUOTIENT(labs(val->value.dur.mon), 12);
		mon = labs(val->value.dur.mon) - 12 * year;

		day = (unsigned long) FQUOTIENT(fabs(val->value.dur.sec), 86400);
		left = fabs(val->value.dur.sec) - day * 86400;
		if (left > 0) {
		    hour = (unsigned long) FQUOTIENT(left, 3600);
		    left = left - (hour * 3600);
		    if (left > 0) {
			min = (unsigned long) FQUOTIENT(left, 60);
			sec = left - (min * 60);
		    }
		}
		if ((val->value.dur.mon < 0) || (val->value.dur.sec < 0))
		    snprintf(buf, 100, "P%luY%luM%luDT%luH%luM%.14gS",
			year, mon, day, hour, min, sec);
		else
		    snprintf(buf, 100, "-P%luY%luM%luDT%luH%luM%.14gS",
			year, mon, day, hour, min, sec);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_GYEAR: {
		char buf[30];
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		snprintf(buf, 30, "%04ld", val->value.date.year);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_GMONTH: {
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		*retValue = xmlMalloc(6);
		if (*retValue == NULL)
		    return(-1);
		snprintf((char *) *retValue, 6, "--%02u",
		    val->value.date.mon);
	    }
	    break;
        case XML_SCHEMAS_GDAY: {
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		*retValue = xmlMalloc(6);
		if (*retValue == NULL)
		    return(-1);
		snprintf((char *) *retValue, 6, "---%02u",
		    val->value.date.day);
	    }
	    break;
        case XML_SCHEMAS_GMONTHDAY: {
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		*retValue = xmlMalloc(8);
		if (*retValue == NULL)
		    return(-1);
		snprintf((char *) *retValue, 8, "--%02u-%02u",
		    val->value.date.mon, val->value.date.day);
	    }
	    break;
        case XML_SCHEMAS_GYEARMONTH: {
		char buf[35];
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		if (val->value.date.year < 0)
		    snprintf(buf, 35, "-%04ld-%02u",
			labs(val->value.date.year),
			val->value.date.mon);
		else
		    snprintf(buf, 35, "%04ld-%02u",
			val->value.date.year, val->value.date.mon);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_TIME:
	    {
		char buf[30];

		if (val->value.date.tz_flag) {
		    xmlSchemaValPtr norm;

		    norm = xmlSchemaDateNormalize(val, 0);
		    if (norm == NULL)
			return (-1);
		    /*
		    * TODO: Check if "%.14g" is portable.
		    */
		    snprintf(buf, 30,
			"%02u:%02u:%02.14gZ",
			norm->value.date.hour,
			norm->value.date.min,
			norm->value.date.sec);
		    xmlSchemaFreeValue(norm);
		} else {
		    snprintf(buf, 30,
			"%02u:%02u:%02.14g",
			val->value.date.hour,
			val->value.date.min,
			val->value.date.sec);
		}
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
        case XML_SCHEMAS_DATE:
	    {
		char buf[30];

		if (val->value.date.tz_flag) {
		    xmlSchemaValPtr norm;

		    norm = xmlSchemaDateNormalize(val, 0);
		    if (norm == NULL)
			return (-1);
		    /*
		    * TODO: Append the canonical value of the
		    * recoverable timezone and not "Z".
		    */
		    snprintf(buf, 30,
			"%04ld-%02u-%02uZ",
			norm->value.date.year, norm->value.date.mon,
			norm->value.date.day);
		    xmlSchemaFreeValue(norm);
		} else {
		    snprintf(buf, 30,
			"%04ld-%02u-%02u",
			val->value.date.year, val->value.date.mon,
			val->value.date.day);
		}
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
        case XML_SCHEMAS_DATETIME:
	    {
		char buf[50];

		if (val->value.date.tz_flag) {
		    xmlSchemaValPtr norm;

		    norm = xmlSchemaDateNormalize(val, 0);
		    if (norm == NULL)
			return (-1);
		    /*
		    * TODO: Check if "%.14g" is portable.
		    */
		    snprintf(buf, 50,
			"%04ld-%02u-%02uT%02u:%02u:%02.14gZ",
			norm->value.date.year, norm->value.date.mon,
			norm->value.date.day, norm->value.date.hour,
			norm->value.date.min, norm->value.date.sec);
		    xmlSchemaFreeValue(norm);
		} else {
		    snprintf(buf, 50,
			"%04ld-%02u-%02uT%02u:%02u:%02.14g",
			val->value.date.year, val->value.date.mon,
			val->value.date.day, val->value.date.hour,
			val->value.date.min, val->value.date.sec);
		}
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_HEXBINARY:
	    *retValue = BAD_CAST xmlStrdup(BAD_CAST val->value.hex.str);
	    break;
	case XML_SCHEMAS_BASE64BINARY:
	    /*
	    * TODO: Is the following spec piece implemented?:
	    * SPEC: "Note: For some values the canonical form defined
	    * above does not conform to [RFC 2045], which requires breaking
	    * with linefeeds at appropriate intervals."
	    */
	    *retValue = BAD_CAST xmlStrdup(BAD_CAST val->value.base64.str);
	    break;
	case XML_SCHEMAS_FLOAT: {
		char buf[30];
		/*
		* |m| < 16777216, -149 <= e <= 104.
		* TODO: Handle, NaN, INF, -INF. The format is not
		* yet conformant. The c type float does not cover
		* the whole range.
		*/
		snprintf(buf, 30, "%01.14e", val->value.f);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_DOUBLE: {
		char buf[40];
		/* |m| < 9007199254740992, -1075 <= e <= 970 */
		/*
		* TODO: Handle, NaN, INF, -INF. The format is not
		* yet conformant. The c type float does not cover
		* the whole range.
		*/
		snprintf(buf, 40, "%01.14e", val->value.d);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	default:
	    *retValue = BAD_CAST xmlStrdup(BAD_CAST "???");
	    return (1);
    }
    if (*retValue == NULL)
	return(-1);
    return (0);
}